

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::ProcessDescriptor::~ProcessDescriptor(ProcessDescriptor *this)

{
  ~ProcessDescriptor(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

ProcessDescriptor::~ProcessDescriptor() = default;